

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectral.hpp
# Opt level: O0

bool __thiscall
kitty::detail::miller_spectral_canonization_impl<kitty::static_truth_table<4U,_true>_>::
normalize_rec(miller_spectral_canonization_impl<kitty::static_truth_table<4U,_true>_> *this,
             spectrum *lspec,uint v)

{
  bool bVar1;
  uint uVar2;
  value_type vVar3;
  spectral_operation sVar4;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> _Var5;
  const_iterator cVar6;
  pair<int,_int> pVar7;
  unordered_map<unsigned_long,_kitty::detail::spectrum,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_kitty::detail::spectrum>_>_>
  *this_00;
  unordered_map<unsigned_long,_kitty::detail::spectrum,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_kitty::detail::spectrum>_>_>
  *puVar8;
  reference pvVar9;
  spectrum *this_01;
  uint in_EDX;
  miller_spectral_canonization_impl<kitty::static_truth_table<4U,_true>_> *in_RSI;
  miller_spectral_canonization_impl<kitty::static_truth_table<4U,_true>_> *in_RDI;
  value_type p_1;
  uint save;
  mapped_type *spec2_1;
  uint k;
  value_type j;
  uint i_1;
  mapped_type *spec2;
  pair<int,_int> p;
  int max;
  int min;
  uint i;
  spectrum *in_stack_ffffffffffffff38;
  unordered_map<unsigned_long,_kitty::detail::spectrum,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_kitty::detail::spectrum>_>_>
  *in_stack_ffffffffffffff40;
  uint in_stack_ffffffffffffff54;
  uint16_t in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5a;
  uint16_t in_stack_ffffffffffffff5e;
  uint in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  uint i_00;
  uint local_80;
  uint local_7c;
  int local_40;
  int iStack_3c;
  uint local_28;
  undefined2 in_stack_ffffffffffffffdc;
  undefined2 in_stack_ffffffffffffffde;
  undefined2 in_stack_ffffffffffffffe0;
  undefined2 in_stack_ffffffffffffffe2;
  bool local_1;
  
  uVar2 = in_RDI->step_counter + 1;
  in_RDI->step_counter = uVar2;
  if (uVar2 == in_RDI->step_limit) {
    local_1 = false;
  }
  else if (in_EDX == in_RDI->num_vars_exp) {
    if (((in_RDI->hasOutputNegation & 1U) != 0) &&
       (vVar3 = spectrum::operator[]
                          ((spectrum *)in_stack_ffffffffffffff40,
                           (size_type)in_stack_ffffffffffffff38), vVar3 < 0)) {
      spectrum::output_negation
                ((spectrum *)
                 CONCAT26(in_stack_ffffffffffffff5e,
                          CONCAT42(in_stack_ffffffffffffff5a,in_stack_ffffffffffffff58)));
      insert((miller_spectral_canonization_impl<kitty::static_truth_table<4U,_true>_> *)
             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
             (spectral_operation *)
             CONCAT26(in_stack_ffffffffffffff5e,
                      CONCAT42(in_stack_ffffffffffffff5a,in_stack_ffffffffffffff58)));
    }
    if ((in_RDI->hasInputNegation & 1U) != 0) {
      for (local_28 = 1; local_28 < in_RDI->num_vars_exp; local_28 = local_28 << 1) {
        vVar3 = spectrum::operator[]
                          ((spectrum *)in_stack_ffffffffffffff40,
                           (size_type)in_stack_ffffffffffffff38);
        if (vVar3 < 0) {
          spectrum::input_negation
                    ((spectrum *)
                     CONCAT26(in_stack_ffffffffffffff5e,
                              CONCAT42(in_stack_ffffffffffffff5a,in_stack_ffffffffffffff58)),
                     in_stack_ffffffffffffff54);
          insert((miller_spectral_canonization_impl<kitty::static_truth_table<4U,_true>_> *)
                 CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                 (spectral_operation *)
                 CONCAT26(in_stack_ffffffffffffff5e,
                          CONCAT42(in_stack_ffffffffffffff5a,in_stack_ffffffffffffff58)));
        }
      }
    }
    closer(in_RDI,(UI *)in_RSI);
    local_1 = true;
  }
  else {
    spectrum::cbegin(in_stack_ffffffffffffff38);
    _Var5 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
            operator+((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                      in_RDI,(difference_type)in_stack_ffffffffffffff40);
    cVar6 = spectrum::cend(in_stack_ffffffffffffff38);
    pVar7 = std::make_pair<int&,int&>((int *)in_stack_ffffffffffffff38,(int *)0x11b5af);
    pVar7 = std::
            accumulate<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,std::pair<int,int>,kitty::detail::miller_spectral_canonization_impl<kitty::static_truth_table<4u,true>>::normalize_rec(kitty::detail::spectrum&,unsigned_int)::_lambda(auto:1,auto:2)_1_>
                      (_Var5._M_current,cVar6._M_current,pVar7);
    local_40 = pVar7.first;
    iStack_3c = pVar7.second;
    if (iStack_3c == 0) {
      std::
      unordered_map<unsigned_long,_kitty::detail::spectrum,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_kitty::detail::spectrum>_>_>
      ::at(in_stack_ffffffffffffff40,(key_type *)in_stack_ffffffffffffff38);
      spectrum::operator=((spectrum *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      bVar1 = normalize_rec(in_RSI,(spectrum *)
                                   CONCAT44(in_EDX,CONCAT22(in_stack_ffffffffffffffe2,
                                                            in_stack_ffffffffffffffe0)),
                            CONCAT22(in_stack_ffffffffffffffde,in_stack_ffffffffffffffdc));
      if (!bVar1) {
        return false;
      }
    }
    else {
      local_7c = 1;
      while( true ) {
        this_00 = (unordered_map<unsigned_long,_kitty::detail::spectrum,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_kitty::detail::spectrum>_>_>
                   *)(ulong)local_7c;
        puVar8 = (unordered_map<unsigned_long,_kitty::detail::spectrum,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_kitty::detail::spectrum>_>_>
                  *)spectrum::size((spectrum *)0x11b674);
        if (puVar8 <= this_00) break;
        pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&in_RDI->order,(ulong)local_7c);
        local_80 = *pvVar9;
        vVar3 = spectrum::operator[]((spectrum *)this_00,(size_type)in_stack_ffffffffffffff38);
        if (vVar3 < 1) {
          vVar3 = -vVar3;
        }
        if ((vVar3 == iStack_3c) && (uVar2 = local_80 & (in_EDX - 1 ^ 0xffffffff), uVar2 != 0)) {
          uVar2 = uVar2 - (uVar2 & uVar2 - 1);
          this_01 = (spectrum *)(ulong)(in_EDX << 1);
          std::
          unordered_map<unsigned_long,_kitty::detail::spectrum,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_kitty::detail::spectrum>_>_>
          ::at(this_00,(key_type *)in_stack_ffffffffffffff38);
          spectrum::operator=((spectrum *)this_00,in_stack_ffffffffffffff38);
          i_00 = in_RDI->transform_index;
          for (local_80 = uVar2 ^ local_80; local_80 != 0;
              local_80 = in_stack_ffffffffffffff60 ^ local_80) {
            in_stack_ffffffffffffff60 = local_80 & -local_80;
            sVar4 = spectrum::spectral_translation(this_01,i_00,in_stack_ffffffffffffff60);
            in_stack_ffffffffffffff5a = sVar4._0_4_;
            in_stack_ffffffffffffff5e = sVar4._var2;
            insert((miller_spectral_canonization_impl<kitty::static_truth_table<4U,_true>_> *)
                   CONCAT44(i_00,in_stack_ffffffffffffff60),
                   (spectral_operation *)
                   CONCAT26(in_stack_ffffffffffffff5e,
                            CONCAT42(in_stack_ffffffffffffff5a,in_stack_ffffffffffffff58)));
          }
          if (uVar2 != in_EDX) {
            sVar4 = spectrum::permutation(this_01,i_00,in_stack_ffffffffffffff60);
            in_stack_ffffffffffffff58 = sVar4._var2;
            insert((miller_spectral_canonization_impl<kitty::static_truth_table<4U,_true>_> *)
                   CONCAT44(i_00,in_stack_ffffffffffffff60),
                   (spectral_operation *)
                   CONCAT26(in_stack_ffffffffffffff5e,
                            CONCAT42(in_stack_ffffffffffffff5a,in_stack_ffffffffffffff58)));
          }
          bVar1 = normalize_rec(in_RSI,(spectrum *)
                                       CONCAT44(in_EDX,CONCAT22(in_stack_ffffffffffffffe2,
                                                                in_stack_ffffffffffffffe0)),
                                CONCAT22(in_stack_ffffffffffffffde,in_stack_ffffffffffffffdc));
          if (!bVar1) {
            return false;
          }
          if ((in_EDX == 1) && (local_40 == iStack_3c)) {
            return true;
          }
          in_RDI->transform_index = i_00;
        }
        local_7c = local_7c + 1;
      }
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool normalize_rec( spectrum& lspec, unsigned v )
  {
    if ( ++step_counter == step_limit )
      return false;

    if ( v == num_vars_exp ) /* leaf case */
    {
      /* invert function if necessary */
      if ( hasOutputNegation && lspec[0u] < 0 )
      {
        insert( lspec.output_negation() );
      }
      /* invert any variable as necessary */
      if ( hasInputNegation )
      {
        for ( auto i = 1u; i < num_vars_exp; i <<= 1 )
        {
          if ( lspec[i] < 0 )
          {
            insert( lspec.input_negation( i ) );
          }
        }
      }

      closer( lspec );
      return true;
    }

    auto min = 0, max = 0;
    const auto p = std::accumulate( lspec.cbegin() + v, lspec.cend(),
                                    std::make_pair( min, max ),
                                    []( auto a, auto sv )
                                    {
                                      return std::make_pair( std::min( a.first, abs( sv ) ), std::max( a.second, abs( sv ) ) );
                                    } );
    min = p.first;
    max = p.second;

    if ( max == 0 )
    {
      auto& spec2 = specs.at( num_vars_exp );
      spec2 = lspec;
      if ( !normalize_rec( spec2, num_vars_exp ) )
        return false;
    }
    else
    {
      for ( auto i = 1u; i < lspec.size(); ++i )
      {
        auto j = order[i];
        if ( abs( lspec[j] ) != max )
        {
          continue;
        }

        /* k = first one bit in j starting from pos v */
        auto k = j & ~( v - 1 ); /* remove 1 bits until v */
        if ( k == 0 )
        {
          continue; /* are there bit left? */
        }
        k = k - ( k & ( k - 1 ) ); /* extract lowest bit */
        j ^= k;                    /* remove bit k from j */

        auto& spec2 = specs.at( v << 1 );
        spec2 = lspec;

        const auto save = transform_index;

        /* spectral translation to all other 1s in j */
        while ( j )
        {
          auto p = j - ( j & ( j - 1 ) );
          insert( spec2.spectral_translation( k, p ) );
          j ^= p;
        }

        if ( k != v )
        {
          insert( spec2.permutation( k, v ) );
        }

        if ( !normalize_rec( spec2, v << 1 ) )
          return false;

        if ( v == 1 && min == max )
        {
          return true;
        }
        transform_index = save;
      }
    }

    return true;
  }